

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osportable.cc
# Opt level: O3

void os_rand(long *val)

{
  if (os_rand::rdev == '\0') {
    os_rand_cold_1();
  }
  os_rand::rdev._M_x = (os_rand::rdev._M_x * 0x41a7) % 0x7fffffff;
  *val = os_rand::rdev._M_x;
  return;
}

Assistant:

void
os_rand( long* val )
{
    static std::default_random_engine rdev(time(0));
    *val = rdev();
}